

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_record.cc
# Opt level: O0

DTLSReadEpoch * bssl::dtls_get_read_epoch(SSL *ssl,uint16_t epoch)

{
  bool bVar1;
  pointer pDVar2;
  pointer pDVar3;
  uint16_t epoch_local;
  SSL *ssl_local;
  
  if (epoch == (ssl->d1->read_epoch).epoch) {
    ssl_local = (SSL *)&ssl->d1->read_epoch;
  }
  else {
    bVar1 = std::operator!=(&ssl->d1->next_read_epoch,(nullptr_t)0x0);
    if ((bVar1) &&
       (pDVar2 = std::unique_ptr<bssl::DTLSReadEpoch,_bssl::internal::Deleter>::operator->
                           (&ssl->d1->next_read_epoch), epoch == pDVar2->epoch)) {
      ssl_local = (SSL *)std::unique_ptr<bssl::DTLSReadEpoch,_bssl::internal::Deleter>::get
                                   (&ssl->d1->next_read_epoch);
    }
    else {
      bVar1 = std::operator!=(&ssl->d1->prev_read_epoch,(nullptr_t)0x0);
      if ((bVar1) &&
         (pDVar3 = std::unique_ptr<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter>::operator->
                             (&ssl->d1->prev_read_epoch), epoch == (pDVar3->epoch).epoch)) {
        ssl_local = (SSL *)std::unique_ptr<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter>::
                           operator->(&ssl->d1->prev_read_epoch);
      }
      else {
        ssl_local = (SSL *)0x0;
      }
    }
  }
  return (DTLSReadEpoch *)ssl_local;
}

Assistant:

DTLSReadEpoch *dtls_get_read_epoch(const SSL *ssl, uint16_t epoch) {
  if (epoch == ssl->d1->read_epoch.epoch) {
    return &ssl->d1->read_epoch;
  }
  if (ssl->d1->next_read_epoch != nullptr &&
      epoch == ssl->d1->next_read_epoch->epoch) {
    return ssl->d1->next_read_epoch.get();
  }
  if (ssl->d1->prev_read_epoch != nullptr &&
      epoch == ssl->d1->prev_read_epoch->epoch.epoch) {
    return &ssl->d1->prev_read_epoch->epoch;
  }
  return nullptr;
}